

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configFileReader.h
# Opt level: O2

void __thiscall configFileReader::configFileReader(configFileReader *this,string *configFile)

{
  vector<char,_std::allocator<char>_> *pvVar1;
  char local_19;
  
  (this->fileName)._M_dataplus._M_p = (pointer)&(this->fileName).field_2;
  (this->fileName)._M_string_length = 0;
  (this->fileName).field_2._M_local_buf[0] = '\0';
  (this->text)._M_dataplus._M_p = (pointer)&(this->text).field_2;
  (this->text)._M_string_length = 0;
  (this->text).field_2._M_local_buf[0] = '\0';
  this->index = 0;
  this->readFromString = false;
  pvVar1 = (vector<char,_std::allocator<char>_> *)operator_new(0x18);
  (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (pvVar1->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  this->septarators = pvVar1;
  this->isOpen = false;
  (this->commentToken)._M_dataplus._M_p = (pointer)&(this->commentToken).field_2;
  (this->commentToken)._M_string_length = 0;
  (this->commentToken).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)this);
  std::__cxx11::string::assign((char *)&this->text);
  local_19 = '\"';
  std::vector<char,_std::allocator<char>_>::emplace_back<char>(this->septarators,&local_19);
  return;
}

Assistant:

configFileReader(string configFile) {
        fileName = configFile;
        text = "";
        septarators->push_back('"');
    }